

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O0

int lws_hdr_copy_fragment(lws *wsi,char *dst,int len,lws_token_indexes h,int frag_idx)

{
  uint local_34;
  int local_30;
  int f;
  int n;
  int frag_idx_local;
  lws_token_indexes h_local;
  int len_local;
  char *dst_local;
  lws *wsi_local;
  
  local_30 = 0;
  if ((wsi->http).ah == (allocated_headers *)0x0) {
    wsi_local._4_4_ = 0xffffffff;
  }
  else {
    local_34 = (uint)((wsi->http).ah)->frag_index[h];
    if (local_34 == 0) {
      wsi_local._4_4_ = 0xffffffff;
    }
    else {
      for (; local_30 < frag_idx; local_30 = local_30 + 1) {
        local_34 = (uint)((wsi->http).ah)->frags[(int)local_34].nfrag;
        if (local_34 == 0) {
          return -1;
        }
      }
      if ((int)(uint)((wsi->http).ah)->frags[(int)local_34].len < len) {
        memcpy(dst,((wsi->http).ah)->data + ((wsi->http).ah)->frags[(int)local_34].offset,
               (ulong)((wsi->http).ah)->frags[(int)local_34].len);
        dst[((wsi->http).ah)->frags[(int)local_34].len] = '\0';
        wsi_local._4_4_ = (uint)((wsi->http).ah)->frags[(int)local_34].len;
      }
      else {
        wsi_local._4_4_ = 0xffffffff;
      }
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int lws_hdr_copy_fragment(struct lws *wsi, char *dst, int len,
				      enum lws_token_indexes h, int frag_idx)
{
	int n = 0;
	int f;

	if (!wsi->http.ah)
		return -1;

	f = wsi->http.ah->frag_index[h];

	if (!f)
		return -1;

	while (n < frag_idx) {
		f = wsi->http.ah->frags[f].nfrag;
		if (!f)
			return -1;
		n++;
	}

	if (wsi->http.ah->frags[f].len >= len)
		return -1;

	memcpy(dst, wsi->http.ah->data + wsi->http.ah->frags[f].offset,
	       wsi->http.ah->frags[f].len);
	dst[wsi->http.ah->frags[f].len] = '\0';

	return wsi->http.ah->frags[f].len;
}